

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O0

int __thiscall
bssl::do_tls_write(bssl *this,SSL *ssl,size_t *out_bytes_written,uint8_t type,
                  Span<const_unsigned_char> in)

{
  uint8_t type_00;
  size_t *ssl_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar *puVar5;
  SSL_PROTOCOL_METHOD *pSVar6;
  pointer pbVar7;
  size_t sVar8;
  undefined7 in_register_00000009;
  Span<unsigned_char> local_c8;
  Span<unsigned_char> local_b8;
  size_t local_a8;
  size_t ciphertext_len;
  ulong local_90;
  size_t max_ciphertext_len;
  size_t max_out;
  uchar *local_78;
  Span<const_unsigned_char> local_70;
  undefined1 local_60 [8];
  Span<const_unsigned_char> pending_flight;
  SSLBuffer *buf;
  size_t local_40;
  int local_38;
  uint8_t local_31;
  int ret;
  uint8_t type_local;
  size_t *out_bytes_written_local;
  SSL *ssl_local;
  Span<const_unsigned_char> in_local;
  
  ssl_local = (SSL *)CONCAT71(in_register_00000009,type);
  in_local.data_ = in.data_;
  local_31 = (uint8_t)out_bytes_written;
  _ret = ssl;
  out_bytes_written_local = (size_t *)this;
  bVar1 = Span<const_unsigned_char>::empty
                    ((Span<const_unsigned_char> *)(*(long *)(this + 0x30) + 0x98));
  if (bVar1) {
LAB_0018ea27:
    local_38 = ssl_write_buffer_flush((SSL *)out_bytes_written_local);
    in_local.size_._4_4_ = local_38;
    if (0 < local_38) {
      bVar1 = Span<const_unsigned_char>::empty
                        ((Span<const_unsigned_char> *)(out_bytes_written_local[6] + 0x98));
      if (bVar1) {
        pending_flight.size_ = out_bytes_written_local[6] + 0x68;
        sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
        if ((sVar2 < 0x4001) &&
           (sVar2 = SSLBuffer::size((SSLBuffer *)pending_flight.size_), sVar2 == 0)) {
          bVar1 = tls_flush_pending_hs_data((SSL *)out_bytes_written_local);
          if (bVar1) {
            Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_60);
            bVar1 = std::operator!=((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                                    (out_bytes_written_local[6] + 0xf0),(nullptr_t)0x0);
            if (bVar1) {
              pbVar7 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                                  (out_bytes_written_local[6] + 0xf0));
              puVar4 = (uchar *)pbVar7->data;
              pbVar7 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                                  (out_bytes_written_local[6] + 0xf0));
              Span<const_unsigned_char>::Span(&local_70,puVar4,pbVar7->length);
              local_60 = (undefined1  [8])local_70.data_;
              pending_flight.data_ = (uchar *)local_70.size_;
              _max_out = Span<const_unsigned_char>::subspan
                                   ((Span<const_unsigned_char> *)local_60,
                                    (ulong)*(uint *)(out_bytes_written_local[6] + 0xf8),
                                    0xffffffffffffffff);
              local_60 = (undefined1  [8])max_out;
              pending_flight.data_ = local_78;
            }
            max_ciphertext_len =
                 Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_60);
            bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
            if (!bVar1) {
              sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
              sVar3 = SSL_max_seal_overhead((SSL *)out_bytes_written_local);
              local_90 = sVar2 + sVar3;
              sVar8 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
              if ((sVar2 + sVar3 < sVar8) || (max_ciphertext_len + local_90 < max_ciphertext_len)) {
                ERR_put_error(0x10,0,0x45,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                              ,0xb6);
                return -1;
              }
              max_ciphertext_len = local_90 + max_ciphertext_len;
            }
            sVar2 = pending_flight.size_;
            if (max_ciphertext_len == 0) {
              _ret->method = (SSL_PROTOCOL_METHOD *)0x0;
              in_local.size_._4_4_ = 1;
            }
            else {
              sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_60);
              sVar8 = tls_seal_align_prefix_len((SSL *)out_bytes_written_local);
              bVar1 = SSLBuffer::EnsureCap((SSLBuffer *)sVar2,sVar3 + sVar8,max_ciphertext_len);
              if (bVar1) {
                bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)local_60);
                if (!bVar1) {
                  _ciphertext_len = SSLBuffer::remaining((SSLBuffer *)pending_flight.size_);
                  puVar4 = Span<unsigned_char>::data((Span<unsigned_char> *)&ciphertext_len);
                  puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_60);
                  sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_60);
                  ::OPENSSL_memcpy(puVar4,puVar5,sVar2);
                  std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::reset
                            ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                             (out_bytes_written_local[6] + 0xf0),(pointer)0x0);
                  sVar2 = pending_flight.size_;
                  *(undefined4 *)(out_bytes_written_local[6] + 0xf8) = 0;
                  sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_60);
                  SSLBuffer::DidWrite((SSLBuffer *)sVar2,sVar3);
                }
                bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
                ssl_00 = out_bytes_written_local;
                if (!bVar1) {
                  local_b8 = SSLBuffer::remaining((SSLBuffer *)pending_flight.size_);
                  puVar4 = Span<unsigned_char>::data(&local_b8);
                  local_c8 = SSLBuffer::remaining((SSLBuffer *)pending_flight.size_);
                  sVar2 = Span<unsigned_char>::size(&local_c8);
                  type_00 = local_31;
                  puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
                  sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
                  bVar1 = tls_seal_record((SSL *)ssl_00,puVar4,&local_a8,sVar2,type_00,puVar5,sVar3)
                  ;
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    return -1;
                  }
                  SSLBuffer::DidWrite((SSLBuffer *)pending_flight.size_,local_a8);
                }
                *(ushort *)(out_bytes_written_local[6] + 0xdc) =
                     *(ushort *)(out_bytes_written_local[6] + 0xdc) & 0xfeff;
                local_38 = ssl_write_buffer_flush((SSL *)out_bytes_written_local);
                if (local_38 < 1) {
                  bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
                  if (!bVar1) {
                    sVar2 = out_bytes_written_local[6];
                    *(SSL **)(sVar2 + 0x98) = ssl_local;
                    *(uchar **)(sVar2 + 0xa0) = in_local.data_;
                    *(uint8_t *)(out_bytes_written_local[6] + 0xa8) = local_31;
                  }
                  in_local.size_._4_4_ = local_38;
                }
                else {
                  pSVar6 = (SSL_PROTOCOL_METHOD *)
                           Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
                  _ret->method = pSVar6;
                  in_local.size_._4_4_ = 1;
                }
              }
              else {
                in_local.size_._4_4_ = -1;
              }
            }
          }
          else {
            in_local.size_._4_4_ = -1;
          }
        }
        else {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                        ,0x9e);
          in_local.size_._4_4_ = -1;
        }
      }
      else {
        pSVar6 = (SSL_PROTOCOL_METHOD *)
                 Span<const_unsigned_char>::size
                           ((Span<const_unsigned_char> *)(out_bytes_written_local[6] + 0x98));
        _ret->method = pSVar6;
        Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&buf);
        sVar2 = out_bytes_written_local[6];
        *(SSLBuffer **)(sVar2 + 0x98) = buf;
        *(size_t *)(sVar2 + 0xa0) = local_40;
        in_local.size_._4_4_ = 1;
      }
    }
  }
  else {
    sVar2 = Span<const_unsigned_char>::size
                      ((Span<const_unsigned_char> *)(out_bytes_written_local[6] + 0x98));
    sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
    if (sVar2 <= sVar3) {
      if ((*(uint *)((long)out_bytes_written_local + 0x84) & 2) == 0) {
        puVar4 = Span<const_unsigned_char>::data
                           ((Span<const_unsigned_char> *)(out_bytes_written_local[6] + 0x98));
        puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
        if (puVar4 != puVar5) goto LAB_0018e9fd;
      }
      if (*(uint8_t *)(out_bytes_written_local[6] + 0xa8) == local_31) goto LAB_0018ea27;
    }
LAB_0018e9fd:
    ERR_put_error(0x10,0,0x76,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x8a);
    in_local.size_._4_4_ = -1;
  }
  return in_local.size_._4_4_;
}

Assistant:

static int do_tls_write(SSL *ssl, size_t *out_bytes_written, uint8_t type,
                        Span<const uint8_t> in) {
  // If there is a pending write, the retry must be consistent.
  if (!ssl->s3->pending_write.empty() &&
      (ssl->s3->pending_write.size() > in.size() ||
       (!(ssl->mode & SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER) &&
        ssl->s3->pending_write.data() != in.data()) ||
       ssl->s3->pending_write_type != type)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_WRITE_RETRY);
    return -1;
  }

  // Flush any unwritten data to the transport. There may be data to flush even
  // if |wpend_tot| is zero.
  int ret = ssl_write_buffer_flush(ssl);
  if (ret <= 0) {
    return ret;
  }

  // If there is a pending write, we just completed it. Report it to the caller.
  if (!ssl->s3->pending_write.empty()) {
    *out_bytes_written = ssl->s3->pending_write.size();
    ssl->s3->pending_write = {};
    return 1;
  }

  SSLBuffer *buf = &ssl->s3->write_buffer;
  if (in.size() > SSL3_RT_MAX_PLAIN_LENGTH || buf->size() > 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return -1;
  }

  if (!tls_flush_pending_hs_data(ssl)) {
    return -1;
  }

  // We may have unflushed handshake data that must be written before |in|. This
  // may be a KeyUpdate acknowledgment, 0-RTT key change messages, or a
  // NewSessionTicket.
  Span<const uint8_t> pending_flight;
  if (ssl->s3->pending_flight != nullptr) {
    pending_flight =
        Span(reinterpret_cast<const uint8_t *>(ssl->s3->pending_flight->data),
             ssl->s3->pending_flight->length);
    pending_flight = pending_flight.subspan(ssl->s3->pending_flight_offset);
  }

  size_t max_out = pending_flight.size();
  if (!in.empty()) {
    const size_t max_ciphertext_len = in.size() + SSL_max_seal_overhead(ssl);
    if (max_ciphertext_len < in.size() ||
        max_out + max_ciphertext_len < max_out) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return -1;
    }
    max_out += max_ciphertext_len;
  }

  if (max_out == 0) {
    // Nothing to write.
    *out_bytes_written = 0;
    return 1;
  }

  if (!buf->EnsureCap(pending_flight.size() + tls_seal_align_prefix_len(ssl),
                      max_out)) {
    return -1;
  }

  // Copy |pending_flight| to the output.
  if (!pending_flight.empty()) {
    OPENSSL_memcpy(buf->remaining().data(), pending_flight.data(),
                   pending_flight.size());
    ssl->s3->pending_flight.reset();
    ssl->s3->pending_flight_offset = 0;
    buf->DidWrite(pending_flight.size());
  }

  if (!in.empty()) {
    size_t ciphertext_len;
    if (!tls_seal_record(ssl, buf->remaining().data(), &ciphertext_len,
                         buf->remaining().size(), type, in.data(), in.size())) {
      return -1;
    }
    buf->DidWrite(ciphertext_len);
  }

  // Now that we've made progress on the connection, uncork KeyUpdate
  // acknowledgments.
  ssl->s3->key_update_pending = false;

  // Flush the write buffer.
  ret = ssl_write_buffer_flush(ssl);
  if (ret <= 0) {
    // Track the unfinished write.
    if (!in.empty()) {
      ssl->s3->pending_write = in;
      ssl->s3->pending_write_type = type;
    }
    return ret;
  }

  *out_bytes_written = in.size();
  return 1;
}